

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

int __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::NSideConnects
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int side)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = pztopology::TPZPrism::SideDimension(side);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  iVar3 = 0;
  if (iVar2 + -2 < iVar1) {
    iVar1 = pztopology::TPZPrism::SideDimension(side);
    iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xb0))(this);
    iVar3 = 1;
    if (iVar1 != iVar2 + -1) {
      iVar1 = pztopology::TPZPrism::SideDimension(side);
      iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xb0))(this);
      iVar3 = (uint)(iVar1 == iVar2) * 2 + -1;
    }
  }
  return iVar3;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::NSideConnects(int side) const{
	if(TSHAPE::SideDimension(side)<= Dimension()-2) return 0;
	if(TSHAPE::SideDimension(side)==Dimension()-1) return 1;
	if(TSHAPE::SideDimension(side)== Dimension()) {
        int ncon = 1;
        return ncon;
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << "Side: " << side <<"unhandled case ";
		LOGPZ_ERROR(logger,sout.str())
	}
#endif
	return -1;

}